

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_encode_se(aec_stream *strm)

{
  internal_state *state_00;
  int iVar1;
  aec_stream *in_RDI;
  internal_state *state;
  uint32_t d;
  size_t i;
  ulong local_10;
  
  state_00 = in_RDI->state;
  emit(state_00,1,state_00->id_len + 1);
  if (state_00->ref != 0) {
    emit(state_00,state_00->ref_sample,in_RDI->bits_per_sample);
  }
  for (local_10 = 0; local_10 < in_RDI->block_size; local_10 = local_10 + 2) {
    iVar1 = state_00->block[local_10] + state_00->block[local_10 + 1];
    emitfs(state_00,((uint)(iVar1 * (iVar1 + 1)) >> 1) + state_00->block[local_10 + 1]);
  }
  iVar1 = m_flush_block(in_RDI);
  return iVar1;
}

Assistant:

static int m_encode_se(struct aec_stream *strm)
{
    size_t i;
    uint32_t d;
    struct internal_state *state = strm->state;

    emit(state, 1, state->id_len + 1);
    if (state->ref)
        emit(state, state->ref_sample, strm->bits_per_sample);

    for (i = 0; i < strm->block_size; i+= 2) {
        d = state->block[i] + state->block[i + 1];
        emitfs(state, d * (d + 1) / 2 + state->block[i + 1]);
    }

    return m_flush_block(strm);
}